

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.h
# Opt level: O3

Orphan<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>_> * __thiscall
capnp::
copyOutOfMembrane<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,(capnp::Kind)5>::Reader>
          (Orphan<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>_>
           *__return_storage_ptr__,capnp *this,Reader *from,Orphanage to,
          Own<capnp::MembranePolicy> *policy)

{
  ListReader from_00;
  MembranePolicy *pMVar1;
  CapTableBuilder *pCVar2;
  Orphanage to_00;
  Own<capnp::MembranePolicy> local_68;
  OrphanBuilder local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  pCVar2 = to.capTable;
  local_38 = *(undefined8 *)this;
  uStack_30 = *(undefined8 *)(this + 8);
  local_28 = *(undefined8 *)(this + 0x10);
  uStack_20 = *(undefined8 *)(this + 0x18);
  local_18 = *(undefined8 *)(this + 0x20);
  uStack_10 = *(undefined8 *)(this + 0x28);
  from_00 = *(ListReader *)this;
  local_68.disposer = (Disposer *)(pCVar2->super_CapTableReader)._vptr_CapTableReader;
  local_68.ptr = (MembranePolicy *)pCVar2[1].super_CapTableReader._vptr_CapTableReader;
  pCVar2[1].super_CapTableReader._vptr_CapTableReader = (_func_int **)0x0;
  to_00.capTable = (CapTableBuilder *)to.arena;
  to_00.arena = (BuilderArena *)from;
  _::copyOutOfMembrane(&local_58,from_00,to_00,&local_68,false);
  pMVar1 = local_68.ptr;
  *(undefined4 *)&(__return_storage_ptr__->builder).segment = local_58.segment._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->builder).segment + 4) = local_58.segment._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->builder).capTable = local_58.capTable._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->builder).capTable + 4) = local_58.capTable._4_4_;
  (__return_storage_ptr__->builder).location = local_58.location;
  (__return_storage_ptr__->builder).tag.content = local_58.tag.content;
  local_58.segment = (SegmentBuilder *)0x0;
  local_58.location = (word *)0x0;
  if (local_68.ptr != (MembranePolicy *)0x0) {
    local_68.ptr = (MembranePolicy *)0x0;
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               pMVar1->_vptr_MembranePolicy[-2] + (long)&pMVar1->_vptr_MembranePolicy);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<typename kj::Decay<Reader>::Reads> copyOutOfMembrane(
    Reader&& from, Orphanage to, kj::Own<MembranePolicy> policy) {
  return _::copyOutOfMembrane(
      _::PointerHelpers<typename kj::Decay<Reader>::Reads>::getInternalReader(from),
      to, kj::mv(policy), false);
}